

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O3

void __thiscall glslang::TIntermLoop::traverse(TIntermLoop *this,TIntermTraverser *it)

{
  pointer *pppTVar1;
  TIntermNode *pTVar2;
  int iVar3;
  TIntermTyped *pTVar4;
  
  if ((it->preVisit == true) &&
     (iVar3 = (*it->_vptr_TIntermTraverser[8])(it,0,this), (char)iVar3 == '\0')) {
    return;
  }
  TIntermTraverser::incrementDepth(it,&this->super_TIntermNode);
  if (it->rightToLeft == true) {
    pTVar4 = this->terminal;
    if (pTVar4 != (TIntermTyped *)0x0) {
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,it);
    }
    pTVar2 = this->body;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
    }
    pTVar4 = this->test;
  }
  else {
    pTVar4 = this->test;
    if (pTVar4 != (TIntermTyped *)0x0) {
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,it);
    }
    pTVar2 = this->body;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
    }
    pTVar4 = this->terminal;
  }
  if (pTVar4 != (TIntermTyped *)0x0) {
    (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,it);
  }
  it->depth = it->depth + -1;
  pppTVar1 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppTVar1 = *pppTVar1 + -1;
  if (it->postVisit != true) {
    return;
  }
  (*it->_vptr_TIntermTraverser[8])(it,2,this);
  return;
}

Assistant:

void TIntermLoop::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitLoop(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            if (terminal)
                terminal->traverse(it);

            if (body)
                body->traverse(it);

            if (test)
                test->traverse(it);
        } else {
            if (test)
                test->traverse(it);

            if (body)
                body->traverse(it);

            if (terminal)
                terminal->traverse(it);
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitLoop(EvPostVisit, this);
}